

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::flatten(Mat *src,Mat *dst,Option *opt)

{
  Layer *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ParamDict pd;
  Layer *flatten;
  int in_stack_ffffffffffffffcc;
  ParamDict *in_stack_ffffffffffffffd0;
  
  this = create_layer(in_stack_ffffffffffffffcc);
  ParamDict::ParamDict(in_stack_ffffffffffffffd0);
  (*this->_vptr_Layer[2])(this,&stack0xffffffffffffffd0);
  (*this->_vptr_Layer[4])(this,in_RDX);
  (*this->_vptr_Layer[7])(this,in_RDI,in_RSI,in_RDX);
  (*this->_vptr_Layer[5])(this,in_RDX);
  if (this != (Layer *)0x0) {
    (*this->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict((ParamDict *)this);
  return;
}

Assistant:

void flatten(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* flatten = create_layer(LayerType::Flatten);

    ParamDict pd;

    flatten->load_param(pd);

    flatten->create_pipeline(opt);

    flatten->forward(src, dst, opt);

    flatten->destroy_pipeline(opt);

    delete flatten;
}